

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O1

upb_test_FakeMessageSet_Item *
upb_test_FakeMessageSet_add_item(upb_test_FakeMessageSet *msg,upb_Arena *arena)

{
  _Bool _Var1;
  upb_Array *array;
  upb_test_FakeMessageSet_Item *__s;
  ulong uVar2;
  upb_MiniTableField field;
  upb_MiniTableField local_30;
  
  local_30.number_dont_copy_me__upb_internal_use_only = 1;
  local_30.offset_dont_copy_me__upb_internal_use_only = 8;
  local_30.presence = 0;
  local_30.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  local_30.descriptortype_dont_copy_me__upb_internal_use_only = '\n';
  local_30.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  array = upb_Message_GetOrCreateMutableArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,&local_30,arena);
  if (array != (upb_Array *)0x0) {
    if ((array->data_dont_copy_me__upb_internal_use_only & 4) != 0) {
      __assert_fail("!upb_Array_IsFrozen(array)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x6c,
                    "bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
                   );
    }
    if (arena == (upb_Arena *)0x0 &&
        array->size_dont_copy_me__upb_internal_use_only != 0xffffffffffffffff) {
      __assert_fail("size <= array->size_dont_copy_me__upb_internal_use_only || arena",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x6e,
                    "bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
                   );
    }
    uVar2 = array->size_dont_copy_me__upb_internal_use_only + 1;
    if ((uVar2 <= array->capacity_dont_copy_me__upb_internal_use_only) ||
       (_Var1 = _upb_Array_Realloc_dont_copy_me__upb_internal_use_only(array,uVar2,arena), _Var1)) {
      array->size_dont_copy_me__upb_internal_use_only = uVar2;
      __s = (upb_test_FakeMessageSet_Item *)arena->ptr_dont_copy_me__upb_internal_use_only;
      if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)__s) < 0x48) {
        __s = (upb_test_FakeMessageSet_Item *)
              _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x48);
      }
      else {
        if ((upb_test_FakeMessageSet_Item *)
            ((ulong)((long)&(__s->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
            0xfffffffffffffff8) != __s) {
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                        ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(__s + 9);
      }
      if (__s == (upb_test_FakeMessageSet_Item *)0x0) {
        __s = (upb_test_FakeMessageSet_Item *)0x0;
      }
      else {
        memset(__s,0,0x48);
      }
      if (__s != (upb_test_FakeMessageSet_Item *)0x0) {
        uVar2 = array->data_dont_copy_me__upb_internal_use_only;
        if ((uVar2 & 4) != 0) {
          __assert_fail("!upb_Array_IsFrozen(array)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                        ,0x7a,
                        "void _upb_Array_Set_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, const void *, size_t)"
                       );
        }
        if (array->size_dont_copy_me__upb_internal_use_only != 0) {
          if ((((uint)uVar2 & 3) + 1) - (uint)((uVar2 & 3) == 0) == 3) {
            *(upb_test_FakeMessageSet_Item **)
             (((uVar2 & 0xfffffffffffffff8) - 8) +
             array->size_dont_copy_me__upb_internal_use_only * 8) = __s;
            return __s;
          }
          __assert_fail("elem_size == 1U << _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(array)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                        ,0x7c,
                        "void _upb_Array_Set_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, const void *, size_t)"
                       );
        }
        __assert_fail("i < array->size_dont_copy_me__upb_internal_use_only",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                      ,0x7b,
                      "void _upb_Array_Set_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, const void *, size_t)"
                     );
      }
    }
  }
  return (upb_test_FakeMessageSet_Item *)0x0;
}

Assistant:

UPB_INLINE struct upb_test_FakeMessageSet_Item* upb_test_FakeMessageSet_add_item(upb_test_FakeMessageSet* msg, upb_Arena* arena) {
  upb_MiniTableField field = {1, 8, 0, 0, 10, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__FakeMessageSet__Item_msg_init);
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(
      UPB_UPCAST(msg), &field, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
                  arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return NULL;
  }
  struct upb_test_FakeMessageSet_Item* sub = (struct upb_test_FakeMessageSet_Item*)_upb_Message_New(&upb_0test__FakeMessageSet__Item_msg_init, arena);
  if (!arr || !sub) return NULL;
  UPB_PRIVATE(_upb_Array_Set)
  (arr, arr->UPB_PRIVATE(size) - 1, &sub, sizeof(sub));
  return sub;
}